

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  char *pcVar2;
  size_t in_RSI;
  nn_chunkref *in_RDI;
  nn_respondent *respondent;
  int rc;
  nn_msg *in_stack_00000040;
  nn_sockbase *in_stack_00000048;
  FILE *__stream;
  nn_chunkref *self_00;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  self_00 = in_RDI;
  if (in_RDI == (nn_chunkref *)0x0) {
    self_00 = (nn_chunkref *)0x0;
  }
  if (((undefined1  [32])self_00[0xd].u & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    nn_chunkref_term(self_00);
    *(uint *)((long)&self_00[0xd].u + 0x10) = *(uint *)((long)&self_00[0xd].u + 0x10) & 0xfffffffe;
  }
  iVar1 = nn_xrespondent_recv(in_stack_00000048,in_stack_00000040);
  if (iVar1 == -0xb) {
    local_4 = -0xb;
  }
  else {
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/survey/respondent.c"
              ,0x96);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_mv((nn_chunkref *)(ulong)in_stack_ffffffffffffffe0,self_00);
    nn_chunkref_init(in_RDI,in_RSI);
    *(uint *)((long)&self_00[0xd].u + 0x10) = *(uint *)((long)&self_00[0xd].u + 0x10) | 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nn_respondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  Cancel current survey and clean up backtrace, if it exists. */
    if (nn_slow (respondent->flags & NN_RESPONDENT_INPROGRESS)) {
        nn_chunkref_term (&respondent->backtrace);
        respondent->flags &= ~NN_RESPONDENT_INPROGRESS;
    }

    /*  Get next survey. */
    rc = nn_xrespondent_recv (&respondent->xrespondent.sockbase, msg);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc == 0, -rc);

    /*  Store the backtrace. */
    nn_chunkref_mv (&respondent->backtrace, &msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 0);

    /*  Remember that survey is being processed. */
    respondent->flags |= NN_RESPONDENT_INPROGRESS;

    return 0;
}